

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

double __thiscall
MidiInApi::getMessage
          (MidiInApi *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *message)

{
  bool bVar1;
  string *this_00;
  MidiInApi *local_58;
  double timeStamp;
  string local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *message_local;
  MidiInApi *this_local;
  
  local_20 = message;
  message_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(message);
  if (((this->inputData_).usingCallback & 1U) == 0) {
    bVar1 = MidiQueue::pop(&(this->inputData_).queue,local_20,(double *)&local_58);
    if (bVar1) {
      this_local = local_58;
    }
    else {
      this_local = (MidiInApi *)0x0;
    }
  }
  else {
    this_00 = &(this->super_MidiApi).errorString_;
    std::__cxx11::string::operator=
              ((string *)this_00,
               "RtMidiIn::getNextMessage: a user callback is currently set for this port.");
    std::__cxx11::string::string((string *)&local_40,(string *)this_00);
    MidiApi::error(&this->super_MidiApi,WARNING,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this_local = (MidiInApi *)0x0;
  }
  return (double)this_local;
}

Assistant:

double MidiInApi :: getMessage( std::vector<unsigned char> *message )
{
  message->clear();

  if ( inputData_.usingCallback ) {
    errorString_ = "RtMidiIn::getNextMessage: a user callback is currently set for this port.";
    error( RtMidiError::WARNING, errorString_ );
    return 0.0;
  }

  double timeStamp;
  if ( !inputData_.queue.pop( message, &timeStamp ) )
    return 0.0;

  return timeStamp;
}